

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O0

int luaB_collectgarbage(lua_State *L)

{
  char cVar1;
  int iVar2;
  int iVar3;
  lua_Integer lVar4;
  ulong uVar5;
  int res_2;
  lua_Integer value;
  int p;
  int res_1;
  int res;
  lua_Integer n;
  int b;
  int k;
  int o;
  lua_State *L_local;
  
  iVar2 = luaL_checkoption(L,1,"collect",luaB_collectgarbage::opts);
  iVar2 = (int)""[iVar2];
  switch(iVar2) {
  case 3:
    iVar2 = lua_gc(L,iVar2);
    iVar3 = lua_gc(L,4);
    if (iVar2 != -1) {
      lua_pushnumber(L,(double)iVar2 + (double)iVar3 / 1024.0);
      return 1;
    }
    break;
  default:
    iVar2 = lua_gc(L,iVar2);
    if (iVar2 != -1) {
      lua_pushinteger(L,(long)iVar2);
      return 1;
    }
    break;
  case 5:
    lVar4 = luaL_optinteger(L,2,0);
    iVar2 = lua_gc(L,iVar2,lVar4);
    if (iVar2 != -1) {
      lua_pushboolean(L,iVar2);
      return 1;
    }
    break;
  case 6:
    iVar2 = lua_gc(L,iVar2);
    if (iVar2 != -1) {
      lua_pushboolean(L,iVar2);
      return 1;
    }
    break;
  case 7:
    iVar2 = lua_gc(L,iVar2);
    iVar2 = pushmode(L,iVar2);
    return iVar2;
  case 8:
    iVar2 = lua_gc(L,iVar2);
    iVar2 = pushmode(L,iVar2);
    return iVar2;
  case 9:
    iVar3 = luaL_checkoption(L,2,(char *)0x0,luaB_collectgarbage::params);
    cVar1 = ""[iVar3];
    uVar5 = luaL_optinteger(L,3,-1);
    iVar2 = lua_gc(L,iVar2,(ulong)(uint)(int)cVar1,uVar5 & 0xffffffff);
    lua_pushinteger(L,(long)iVar2);
    return 1;
  }
  lua_pushnil(L);
  return 1;
}

Assistant:

static int luaB_collectgarbage (lua_State *L) {
  static const char *const opts[] = {"stop", "restart", "collect",
    "count", "step", "isrunning", "generational", "incremental",
    "param", NULL};
  static const char optsnum[] = {LUA_GCSTOP, LUA_GCRESTART, LUA_GCCOLLECT,
    LUA_GCCOUNT, LUA_GCSTEP, LUA_GCISRUNNING, LUA_GCGEN, LUA_GCINC,
    LUA_GCPARAM};
  int o = optsnum[luaL_checkoption(L, 1, "collect", opts)];
  switch (o) {
    case LUA_GCCOUNT: {
      int k = lua_gc(L, o);
      int b = lua_gc(L, LUA_GCCOUNTB);
      checkvalres(k);
      lua_pushnumber(L, (lua_Number)k + ((lua_Number)b/1024));
      return 1;
    }
    case LUA_GCSTEP: {
      lua_Integer n = luaL_optinteger(L, 2, 0);
      int res = lua_gc(L, o, cast_sizet(n));
      checkvalres(res);
      lua_pushboolean(L, res);
      return 1;
    }
    case LUA_GCISRUNNING: {
      int res = lua_gc(L, o);
      checkvalres(res);
      lua_pushboolean(L, res);
      return 1;
    }
    case LUA_GCGEN: {
      return pushmode(L, lua_gc(L, o));
    }
    case LUA_GCINC: {
      return pushmode(L, lua_gc(L, o));
    }
    case LUA_GCPARAM: {
      static const char *const params[] = {
        "minormul", "majorminor", "minormajor",
        "pause", "stepmul", "stepsize", NULL};
      static const char pnum[] = {
        LUA_GCPMINORMUL, LUA_GCPMAJORMINOR, LUA_GCPMINORMAJOR,
        LUA_GCPPAUSE, LUA_GCPSTEPMUL, LUA_GCPSTEPSIZE};
      int p = pnum[luaL_checkoption(L, 2, NULL, params)];
      lua_Integer value = luaL_optinteger(L, 3, -1);
      lua_pushinteger(L, lua_gc(L, o, p, (int)value));
      return 1;
    }
    default: {
      int res = lua_gc(L, o);
      checkvalres(res);
      lua_pushinteger(L, res);
      return 1;
    }
  }
  luaL_pushfail(L);  /* invalid call (inside a finalizer) */
  return 1;
}